

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

int * Abc_NamStrHashFind(Abc_Nam_t *p,char *pStr,char *pLim)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int *piVar6;
  
  piVar6 = p->pBins;
  iVar3 = Abc_NamStrHash(pStr,pLim,p->nBins);
  if (*pStr == '\0') {
    __assert_fail("*pStr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                  ,0x137,"int *Abc_NamStrHashFind(Abc_Nam_t *, const char *, const char *)");
  }
  piVar6 = piVar6 + iVar3;
  iVar3 = *piVar6;
  if (iVar3 != 0) goto LAB_00387d88;
  pcVar4 = (char *)0x0;
LAB_00387d90:
  if (pcVar4 == (char *)0x0) {
    return piVar6;
  }
  pcVar5 = pStr;
  if (pLim == (char *)0x0) {
    do {
      cVar1 = *pcVar5;
      if (cVar1 == '\0') goto LAB_00387dcd;
      pcVar5 = pcVar5 + 1;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 == cVar2);
  }
  else {
    do {
      if (pLim <= pcVar5) goto LAB_00387dcd;
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 == cVar2);
  }
  goto LAB_00387dd2;
LAB_00387dcd:
  if (*pcVar4 == '\0') {
    return piVar6;
  }
LAB_00387dd2:
  iVar3 = *piVar6;
  if (((long)iVar3 < 0) || ((p->vInt2Next).nSize <= iVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar6 = (p->vInt2Next).pArray + iVar3;
  iVar3 = *piVar6;
  pcVar4 = (char *)0x0;
  if (iVar3 != 0) {
LAB_00387d88:
    pcVar4 = Abc_NamIntToStr(p,iVar3);
  }
  goto LAB_00387d90;
}

Assistant:

static inline int * Abc_NamStrHashFind( Abc_Nam_t * p, const char * pStr, const char * pLim )
{
    char * pThis;
    int * pPlace = (int *)(p->pBins + Abc_NamStrHash( pStr, pLim, p->nBins ));
    assert( *pStr );
    for ( pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL; 
          pThis;    pPlace = Abc_NamIntToNextP(p, *pPlace), 
          pThis = (*pPlace)? Abc_NamIntToStr(p, *pPlace) : NULL )
              if ( !Abc_NamStrcmp( (char *)pStr, (char *)pLim, pThis ) )
                  break;
    return pPlace;
}